

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v9::detail::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  uint uVar2;
  byte *pbVar3;
  _func_int **pp_Var4;
  ulong uVar5;
  int iVar6;
  ulong __maxlen;
  char format [7];
  char local_47 [7];
  double local_40;
  long local_38;
  
  local_40 = value;
  if (buf->capacity_ <= buf->size_) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/_deps/fmt-src/include/fmt/format.h"
                ,0x62e,"empty buffer");
  }
  if (((ulong)specs & 0xff00000000) != 0x300000000) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/_deps/fmt-src/include/fmt/format.h"
                ,0x62f,"");
  }
  local_47[0] = '%';
  if ((specs._4_4_ >> 0x13 & 1) == 0) {
    pbVar3 = (byte *)(local_47 + 1);
  }
  else {
    pbVar3 = (byte *)(local_47 + 2);
    local_47[1] = 0x23;
  }
  if (-1 < precision) {
    pbVar3[0] = 0x2e;
    pbVar3[1] = 0x2a;
    pbVar3 = pbVar3 + 2;
  }
  *pbVar3 = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  pbVar3[1] = 0;
  sVar1 = buf->size_;
  local_38 = sVar1 + 1;
  do {
    __maxlen = buf->capacity_ - sVar1;
    if (precision < 0) {
      uVar2 = snprintf(buf->ptr_ + sVar1,__maxlen,local_47,local_40);
    }
    else {
      uVar2 = snprintf(buf->ptr_ + sVar1,__maxlen,local_47,local_40,precision);
    }
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 0) {
      iVar6 = 3;
      if (buf->capacity_ != 0xffffffffffffffff) {
        uVar5 = buf->capacity_ + 1;
        pp_Var4 = buf->_vptr_buffer;
        iVar6 = 3;
LAB_0016b78f:
        (**pp_Var4)(buf,uVar5);
      }
    }
    else if (uVar5 < __maxlen) {
      uVar5 = uVar5 + sVar1;
      if (buf->capacity_ < uVar5) {
        (**buf->_vptr_buffer)(buf,uVar5);
      }
      if (buf->capacity_ < uVar5) {
        uVar5 = buf->capacity_;
      }
      buf->size_ = uVar5;
      iVar6 = 1;
    }
    else {
      uVar5 = uVar5 + local_38;
      iVar6 = 0;
      if (buf->capacity_ < uVar5) {
        pp_Var4 = buf->_vptr_buffer;
        iVar6 = 0;
        goto LAB_0016b78f;
      }
    }
    if ((iVar6 != 0) && (iVar6 != 3)) {
      return 0;
    }
  } while( true );
}

Assistant:

auto snprintf_float(T value, int precision, float_specs specs,
                    buffer<char>& buf) -> int {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  FMT_ASSERT(specs.format == float_format::hex, "");
  static_assert(!std::is_same<T, float>::value, "");

  // Build the format string.
  char format[7];  // The longest format is "%#.*Le".
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.upper ? 'A' : 'a';
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
    abort_fuzzing_if(precision > 100000);
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size < capacity) {
      buf.try_resize(size + offset);
      return 0;
    }
    buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
  }
}